

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O1

FMFieldPtr get_local_FieldPtr(FMFormat format,char *fieldname)

{
  FMFieldPtr p_Var1;
  
  p_Var1 = get_FMfieldPtr(format,fieldname);
  if (p_Var1 != (FMFieldPtr)0x0) {
    p_Var1->byte_swap = '\0';
  }
  return p_Var1;
}

Assistant:

extern FMFieldPtr
get_local_FieldPtr(FMFormat format, const char *fieldname)
{
    FMFieldPtr ret_val = get_FMfieldPtr(format, fieldname);

    /* 
     * get_local_FieldPtr() differs from get_FMfieldPtr() only in
     * that the byte_swap value is always false.  This is because
     * local Field ptrs are to be used with the records returned
     * from local conversions.  A local conversion already has
     * performed the byte_swapping. 
     */
    if (ret_val)
	ret_val->byte_swap = 0;
    return ret_val;
}